

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackframe.cpp
# Opt level: O1

StackFrameEntry __thiscall stackjit::StackFrame::getArgument(StackFrame *this,size_t index)

{
  RegisterValue *pRVar1;
  FunctionDefinition *this_00;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *pvVar2;
  StackFrameEntry SVar3;
  
  pRVar1 = this->mBasePtr;
  this_00 = ManagedFunction::def(this->mFunction);
  pvVar2 = FunctionDefinition::parameters(this_00);
  SVar3.mType = (pvVar2->
                super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[index];
  SVar3.mValue = pRVar1 + (-1 - index);
  return SVar3;
}

Assistant:

StackFrameEntry StackFrame::getArgument(std::size_t index) const {
		RegisterValue* argsStart = mBasePtr - 1;
		return StackFrameEntry(argsStart - index, mFunction->def().parameters()[index]);
	}